

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O2

int32_t mm_accumulate_epi16(__m128i vec_a)

{
  short in_XMM0_Wa;
  short in_XMM0_Wb;
  short in_XMM0_Wc;
  short in_XMM0_Wd;
  short in_XMM0_We;
  short in_XMM0_Wf;
  short in_XMM0_Wg;
  short in_XMM0_Wh;
  
  return (int32_t)(ushort)(in_XMM0_Wh + in_XMM0_Wd + in_XMM0_Wf + in_XMM0_Wb +
                          in_XMM0_Wg + in_XMM0_Wc + in_XMM0_We + in_XMM0_Wa);
}

Assistant:

static inline int32_t mm_accumulate_epi16(__m128i vec_a) {
  __m128i vtmp = _mm_srli_si128(vec_a, 8);
  vec_a = _mm_add_epi16(vec_a, vtmp);
  vtmp = _mm_srli_si128(vec_a, 4);
  vec_a = _mm_add_epi16(vec_a, vtmp);
  vtmp = _mm_srli_si128(vec_a, 2);
  vec_a = _mm_add_epi16(vec_a, vtmp);
  return _mm_extract_epi16(vec_a, 0);
}